

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  bool collectComments;
  bool bVar1;
  UInt UVar2;
  Value *pVVar3;
  OurCharReader *this_00;
  Value *this_01;
  OurFeatures local_30;
  
  this_01 = &this->settings_;
  pVVar3 = Value::operator[](this_01,"collectComments");
  collectComments = Value::asBool(pVVar3);
  local_30.allowSpecialFloats_ = false;
  local_30.skipBom_ = false;
  local_30._10_6_ = 0;
  pVVar3 = Value::operator[](this_01,"allowComments");
  local_30.allowComments_ = Value::asBool(pVVar3);
  pVVar3 = Value::operator[](this_01,"allowTrailingCommas");
  local_30.allowTrailingCommas_ = Value::asBool(pVVar3);
  pVVar3 = Value::operator[](this_01,"strictRoot");
  local_30.strictRoot_ = Value::asBool(pVVar3);
  pVVar3 = Value::operator[](this_01,"allowDroppedNullPlaceholders");
  local_30.allowDroppedNullPlaceholders_ = Value::asBool(pVVar3);
  pVVar3 = Value::operator[](this_01,"allowNumericKeys");
  local_30.allowNumericKeys_ = Value::asBool(pVVar3);
  pVVar3 = Value::operator[](this_01,"allowSingleQuotes");
  local_30.allowSingleQuotes_ = Value::asBool(pVVar3);
  pVVar3 = Value::operator[](this_01,"stackLimit");
  UVar2 = Value::asUInt(pVVar3);
  local_30.stackLimit_ = (size_t)UVar2;
  pVVar3 = Value::operator[](this_01,"failIfExtra");
  local_30.failIfExtra_ = Value::asBool(pVVar3);
  pVVar3 = Value::operator[](this_01,"rejectDupKeys");
  local_30.rejectDupKeys_ = Value::asBool(pVVar3);
  pVVar3 = Value::operator[](this_01,"allowSpecialFloats");
  bVar1 = Value::asBool(pVVar3);
  local_30.allowSpecialFloats_ = bVar1;
  pVVar3 = Value::operator[](this_01,"skipBom");
  bVar1 = Value::asBool(pVVar3);
  local_30.skipBom_ = bVar1;
  this_00 = (OurCharReader *)operator_new(0x140);
  OurCharReader::OurCharReader(this_00,collectComments,&local_30);
  return &this_00->super_CharReader;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const {
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.allowTrailingCommas_ = settings_["allowTrailingCommas"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ =
      settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();

  // Stack limit is always a size_t, so we get this as an unsigned int
  // regardless of it we have 64-bit integer support enabled.
  features.stackLimit_ = static_cast<size_t>(settings_["stackLimit"].asUInt());
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  features.allowSpecialFloats_ = settings_["allowSpecialFloats"].asBool();
  features.skipBom_ = settings_["skipBom"].asBool();
  return new OurCharReader(collectComments, features);
}